

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::detail::ElementsAreMatcherBase::
Check<0,1,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::tuple<iutest::detail::GeMatcher<int>,iutest::detail::GtMatcher<int>>>
          (AssertionResult *__return_storage_ptr__,ElementsAreMatcherBase *this,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> it,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end,
          tuple<iutest::detail::GeMatcher<int>,_iutest::detail::GtMatcher<int>_> *matchers)

{
  AssertionResult *pAVar1;
  type **in_R9;
  int local_78 [4];
  AssertionResult local_68;
  int *local_40;
  ElementsAreMatcherBase *local_38;
  ulong local_30;
  size_t cnt;
  tuple<iutest::detail::GeMatcher<int>,_iutest::detail::GtMatcher<int>_> *matchers_local;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end_local;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> it_local;
  
  local_40 = it._M_current;
  local_38 = this;
  cnt = (size_t)end._M_current;
  matchers_local =
       (tuple<iutest::detail::GeMatcher<int>,_iutest::detail::GtMatcher<int>_> *)it._M_current;
  end_local._M_current = (int *)this;
  local_30 = std::
             distance<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                       ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                        this,it);
  if (local_30 < 2) {
    AssertionFailure();
    pAVar1 = AssertionResult::operator<<(&local_68,(char (*) [23])"ElementsAre: argument[");
    pAVar1 = AssertionResult::operator<<(pAVar1,&local_30);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [16])"] is less than ");
    local_78[0] = 2;
    pAVar1 = AssertionResult::operator<<(pAVar1,local_78);
    AssertionResult::AssertionResult(__return_storage_ptr__,pAVar1);
    AssertionResult::~AssertionResult(&local_68);
  }
  else {
    CheckElem<0,1,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::tuple<iutest::detail::GeMatcher<int>,iutest::detail::GtMatcher<int>>>
              (__return_storage_ptr__,(ElementsAreMatcherBase *)end_local._M_current,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               matchers_local,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)cnt,
               (tuple<iutest::detail::GeMatcher<int>,_iutest::detail::GtMatcher<int>_> *)
               &iutest_type_traits::enabler_t<void>::value,in_R9);
  }
  return __return_storage_ptr__;
}

Assistant:

static AssertionResult Check(Ite it, Ite end, M& matchers)
    {
        const size_t cnt = ::std::distance(it, end);
        if IUTEST_COND_UNLIKELY( cnt < LAST+1 )
        {
            return AssertionFailure() << "ElementsAre: argument[" << cnt << "] is less than " << LAST+1;
        }